

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O1

mkroom * search_special(level *lev,schar type)

{
  char cVar1;
  mkroom *pmVar2;
  mkroom *pmVar3;
  
  if (-1 < lev->rooms[0].hx) {
    pmVar3 = lev->rooms;
    do {
      if (type == -2) {
        if ('\x11' < pmVar3->rtype) {
          return pmVar3;
        }
      }
      else if ((type == -1) && (pmVar3->rtype != '\0')) {
        return pmVar3;
      }
      if (pmVar3->rtype == type) {
        return pmVar3;
      }
      pmVar2 = pmVar3 + 1;
      pmVar3 = pmVar3 + 1;
    } while (-1 < pmVar2->hx);
  }
  pmVar3 = lev->subrooms;
  cVar1 = pmVar3->hx;
  do {
    if (cVar1 < '\0') {
      return (mkroom *)0x0;
    }
    if (type == -2) {
      if ('\x11' < pmVar3->rtype) {
        return pmVar3;
      }
    }
    else if ((type == -1) && (pmVar3->rtype != '\0')) {
      return pmVar3;
    }
    if (pmVar3->rtype == type) {
      return pmVar3;
    }
    cVar1 = pmVar3[1].hx;
    pmVar3 = pmVar3 + 1;
  } while( true );
}

Assistant:

struct mkroom *search_special(struct level *lev, schar type)
{
	struct mkroom *croom;

	for (croom = &lev->rooms[0]; croom->hx >= 0; croom++)
	    if ((type == ANY_TYPE && croom->rtype != OROOM) ||
	       (type == ANY_SHOP && croom->rtype >= SHOPBASE) ||
	       croom->rtype == type)
		return croom;
	for (croom = &lev->subrooms[0]; croom->hx >= 0; croom++)
	    if ((type == ANY_TYPE && croom->rtype != OROOM) ||
	       (type == ANY_SHOP && croom->rtype >= SHOPBASE) ||
	       croom->rtype == type)
		return croom;
	return NULL;
}